

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::UniformInfiniteLight::Phi(UniformInfiniteLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar6;
  SampledSpectrum local_10;
  
  fVar1 = this->sceneRadius;
  fVar2 = this->scale;
  auVar5 = (undefined1  [56])0x0;
  SVar6 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar4._0_8_ = SVar6.values.values._0_8_;
  auVar4._8_56_ = auVar5;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar6.values.values._8_8_;
  local_10.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar3);
  SVar6 = SampledSpectrum::operator*(&local_10,fVar1 * fVar1 * 39.47842 * fVar2);
  return (array<float,_4>)(array<float,_4>)SVar6;
}

Assistant:

SampledSpectrum UniformInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * Lemit.Sample(lambda);
}